

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerimeterPointCoordinate.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::PerimeterPointCoordinate::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,PerimeterPointCoordinate *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"X: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32X);
  poVar1 = std::operator<<(poVar1,",  Y: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Y);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString PerimeterPointCoordinate::GetAsString() const
{
    KStringStream ss;

    ss << "X: "    << m_f32X
       << ",  Y: " << m_f32Y
       << "\n";

    return ss.str();
}